

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

Am_Wrapper * examples_of_selected_class_proc(Am_Object *self)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object local_50;
  Am_String local_48;
  Am_String class_name;
  Am_Object curr_example;
  Am_Object local_28;
  Am_Object cls;
  Am_Value_List l;
  Am_Object *self_local;
  
  Am_Value_List::Am_Value_List((Am_Value_List *)&cls);
  pAVar2 = (Am_Value *)Am_Object::Get(0x5510,0x169);
  Am_Object::Am_Object(&local_28,pAVar2);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) != 0) {
    pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_28,(ulong)(ushort)CLASS_EXAMPLES);
    Am_Value_List::operator=((Am_Value_List *)&cls,pAVar2);
  }
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)self,0x169);
  Am_Object::Am_Object((Am_Object *)&class_name,pAVar2);
  Am_Value_List::Start();
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) != 0) {
    Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&class_name);
    bVar1 = Am_Value_List::Member((Am_Wrapper *)&cls);
    if ((bVar1 & 1) != 0) goto LAB_0010cea0;
  }
  Am_Object::Set((ushort)self,0x169,0);
LAB_0010cea0:
  Am_String::Am_String(&local_48);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) == 0) {
    Am_String::operator=(&local_48,"");
  }
  else {
    pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_28,(ulong)(ushort)CLASS_NAME);
    Am_String::operator=(&local_48,pAVar2);
  }
  Am_Object::Set(0x5518,(Am_String *)0x169,(ulong)&local_48);
  Am_Object::Get_Object((ushort)&local_50,0x115518);
  Am_Object::Set((ushort)&local_50,(Am_String *)0x169,(ulong)&local_48);
  Am_Object::~Am_Object(&local_50);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&cls);
  Am_String::~Am_String(&local_48);
  Am_Object::~Am_Object((Am_Object *)&class_name);
  Am_Object::~Am_Object(&local_28);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&cls);
  return pAVar3;
}

Assistant:

Am_Define_Value_List_Formula(examples_of_selected_class)
{
  // fetch current class's examples
  Am_Value_List l;
  Am_Object cls = class_panel.Get(Am_VALUE);

  if (cls.Valid())
    l = cls.Get(CLASS_EXAMPLES);

  // if currently-selected example is no longer in the list, unselect it
  Am_Object curr_example = self.Get(Am_VALUE);
  l.Start();
  if (!curr_example.Valid() || !l.Member(curr_example))
    self.Set(Am_VALUE, 0);

  // incidentally set the name into current_class_name widget
  Am_String class_name;
  if (cls.Valid())
    class_name = cls.Get(CLASS_NAME);
  else
    class_name = "";
  current_class_name.Set(Am_VALUE, class_name);
  current_class_name.Get_Object(Am_COMMAND).Set(Am_VALUE, class_name);

  return l;
}